

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O1

QList<QNetworkCookie> * __thiscall
QNetworkCookieJar::cookiesForUrl
          (QList<QNetworkCookie> *__return_storage_ptr__,QNetworkCookieJar *this,QUrl *url)

{
  long lVar1;
  int *piVar2;
  storage_type_conflict *psVar3;
  qsizetype qVar4;
  char cVar5;
  bool bVar6;
  byte bVar7;
  char cVar8;
  CutResult CVar9;
  iterator iVar10;
  iterator iVar11;
  ulong uVar12;
  storage_type_conflict *psVar13;
  QArrayData *pQVar14;
  char16_t *pcVar15;
  long lVar16;
  QArrayData *pQVar17;
  iterator __i;
  QNetworkCookie *pQVar18;
  long in_FS_OFFSET;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QLatin1String QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView domain;
  QLatin1String QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QDateTime now;
  QString local_a8;
  QArrayData *local_90;
  storage_type_conflict *local_88;
  long local_80;
  QString local_78;
  QDateTime local_60 [8];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  QArrayData *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::currentDateTimeUtc();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QNetworkCookie *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QUrl::scheme();
  if (local_48 == (QArrayData *)0x5) {
    QVar19.m_data._4_4_ = uStack_4c;
    QVar19.m_data._0_4_ = uStack_50;
    QVar19.m_size = 5;
    QVar25.m_data = "https";
    QVar25.m_size = 5;
    cVar5 = QtPrivate::equalStrings(QVar19,QVar25);
  }
  else {
    cVar5 = '\0';
  }
  piVar2 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,0x10);
    }
  }
  lVar16 = *(long *)(lVar1 + 0x88);
  if (lVar16 != 0) {
    pQVar18 = *(QNetworkCookie **)(lVar1 + 0x80);
    lVar16 = lVar16 << 3;
    do {
      if ((cVar5 != '\0') || (bVar6 = QNetworkCookie::isSecure(pQVar18), !bVar6)) {
        bVar6 = QNetworkCookie::isSessionCookie(pQVar18);
        if (bVar6) {
          bVar7 = 0;
        }
        else {
          QNetworkCookie::expirationDate((QNetworkCookie *)local_60);
          bVar7 = compareThreeWay(local_60,(QDateTime *)&local_40);
          bVar7 = bVar7 >> 7;
          QDateTime::~QDateTime(local_60);
        }
        if (bVar7 == 0) {
          local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          local_58 = 0xaaaaaaaa;
          uStack_54 = 0xaaaaaaaa;
          uStack_50 = 0xaaaaaaaa;
          uStack_4c = 0xaaaaaaaa;
          QUrl::host(&local_58,url,0x7f00000);
          local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QNetworkCookie::domain(&local_78,pQVar18);
          pQVar17 = local_48;
          qVar4 = local_78.d.size;
          pcVar15 = local_78.d.ptr;
          psVar3 = (storage_type_conflict *)CONCAT44(uStack_4c,uStack_50);
          if (((QArrayData *)local_78.d.size == (QArrayData *)0x0) || (*local_78.d.ptr != L'.')) {
            psVar13 = local_78.d.ptr;
            pQVar14 = (QArrayData *)local_78.d.size;
            if (local_48 == (QArrayData *)local_78.d.size) {
LAB_0018b8bb:
              QVar21.m_data = psVar3;
              QVar21.m_size = (qsizetype)pQVar17;
              QVar27.m_data = psVar13;
              QVar27.m_size = (qsizetype)pQVar14;
              cVar8 = QtPrivate::equalStrings(QVar21,QVar27);
              if (cVar8 != '\0') goto LAB_0018b8c8;
            }
          }
          else {
            QVar20.m_data = psVar3;
            QVar20.m_size = (qsizetype)local_48;
            QVar26.m_data = local_78.d.ptr;
            QVar26.m_size = local_78.d.size;
            cVar8 = QtPrivate::endsWith(QVar20,QVar26,CaseSensitive);
            if (cVar8 == '\0') {
              local_90 = (QArrayData *)0x1;
              local_a8.d.d = (Data *)0xffffffffffffffff;
              CVar9 = QtPrivate::QContainerImplHelper::mid
                                (qVar4,(qsizetype *)&local_90,(qsizetype *)&local_a8);
              pQVar14 = &(local_a8.d.d)->super_QArrayData;
              if (CVar9 == Null) {
                pQVar14 = (QArrayData *)0x0;
              }
              if (pQVar14 == pQVar17) {
                if (CVar9 == Null) {
                  psVar13 = (storage_type_conflict *)0x0;
                }
                else {
                  psVar13 = pcVar15 + (long)local_90;
                }
                goto LAB_0018b8bb;
              }
            }
            else {
LAB_0018b8c8:
              QUrl::path(&local_90,url,0x7f00000);
              lVar1 = local_80;
              psVar3 = local_88;
              QNetworkCookie::path(&local_a8,pQVar18);
              qVar4 = local_a8.d.size;
              pcVar15 = local_a8.d.ptr;
              if ((((local_a8.d.size != 1 || lVar1 != 0) ||
                   (QVar22.m_data = "/", QVar22.m_size = 1, QVar28.m_data = local_a8.d.ptr,
                   QVar28.m_size = local_a8.d.size, cVar8 = QtPrivate::equalStrings(QVar22,QVar28),
                   cVar8 == '\0')) &&
                  (QVar23.m_data = psVar3, QVar23.m_size = lVar1, QVar29.m_data = pcVar15,
                  QVar29.m_size = qVar4, cVar8 = QtPrivate::startsWith(QVar23,QVar29,CaseSensitive),
                  cVar8 == '\0')) ||
                 (((bVar6 = true, lVar1 != qVar4 && ((qVar4 == 0 || (pcVar15[qVar4 + -1] != L'/'))))
                  && (psVar3[qVar4] != L'/')))) {
                bVar6 = false;
              }
              if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (local_90 != (QArrayData *)0x0) {
                LOCK();
                (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_90,2,0x10);
                }
              }
              if (bVar6) {
                pcVar15 = local_78.d.ptr;
                pQVar17 = (QArrayData *)local_78.d.size;
                if (((QArrayData *)local_78.d.size != (QArrayData *)0x0) &&
                   (*local_78.d.ptr == L'.')) {
                  pcVar15 = local_78.d.ptr + 1;
                  pQVar17 = (QArrayData *)
                            ((long)&((QArrayData *)(local_78.d.size + -0x10))->alloc + 7);
                }
                if (((local_48 == pQVar17) &&
                    (QVar24.m_data._4_4_ = uStack_4c, QVar24.m_data._0_4_ = uStack_50,
                    QVar24.m_size = (qsizetype)local_48, QVar30.m_data = pcVar15,
                    QVar30.m_size = (qsizetype)pQVar17,
                    cVar8 = QtPrivate::equalStrings(QVar24,QVar30), cVar8 != '\0')) ||
                   (domain.m_data = pcVar15, domain.m_size = (qsizetype)pQVar17,
                   bVar6 = qIsEffectiveTLD(domain), !bVar6)) {
                  QtPrivate::QMovableArrayOps<QNetworkCookie>::emplace<QNetworkCookie_const&>
                            ((QMovableArrayOps<QNetworkCookie> *)__return_storage_ptr__,
                             (__return_storage_ptr__->d).size,pQVar18);
                  QList<QNetworkCookie>::end(__return_storage_ptr__);
                }
              }
            }
          }
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
          piVar2 = (int *)CONCAT44(uStack_54,local_58);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,0x10);
            }
          }
        }
      }
      pQVar18 = pQVar18 + 1;
      lVar16 = lVar16 + -8;
    } while (lVar16 != 0);
  }
  iVar10 = QList<QNetworkCookie>::begin(__return_storage_ptr__);
  iVar11 = QList<QNetworkCookie>::end(__return_storage_ptr__);
  if (iVar10.i != iVar11.i) {
    uVar12 = (long)iVar11.i - (long)iVar10.i >> 3;
    lVar1 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<QList<QNetworkCookie>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
              (iVar10.i,iVar11.i,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)iVar11.i - (long)iVar10.i < 0x81) {
      std::
      __insertion_sort<QList<QNetworkCookie>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
                (iVar10.i,iVar11.i);
    }
    else {
      pQVar18 = iVar10.i + 0x10;
      std::
      __insertion_sort<QList<QNetworkCookie>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
                (iVar10.i,pQVar18);
      for (; pQVar18 != iVar11.i; pQVar18 = pQVar18 + 1) {
        std::
        __unguarded_linear_insert<QList<QNetworkCookie>::iterator,__gnu_cxx::__ops::_Val_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
                  (pQVar18);
      }
    }
  }
  QDateTime::~QDateTime((QDateTime *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QNetworkCookie> QNetworkCookieJar::cookiesForUrl(const QUrl &url) const
{
//     \b Warning! This is only a dumb implementation!
//     It does NOT follow all of the recommendations from
//     http://wp.netscape.com/newsref/std/cookie_spec.html
//     It does not implement a very good cross-domain verification yet.

    Q_D(const QNetworkCookieJar);
    const QDateTime now = QDateTime::currentDateTimeUtc();
    QList<QNetworkCookie> result;
    const bool isEncrypted = url.scheme() == "https"_L1;

    // scan our cookies for something that matches
    for (const auto &cookie : std::as_const(d->allCookies)) {
        if (!isEncrypted && cookie.isSecure())
            continue;
        if (!cookie.isSessionCookie() && cookie.expirationDate() < now)
            continue;
        const QString urlHost = url.host();
        const QString cookieDomain = cookie.domain();
        if (!isParentDomain(urlHost, cookieDomain))
            continue;
        if (!isParentPath(url.path(), cookie.path()))
            continue;

        QStringView domain = cookieDomain;
        if (domain.startsWith(u'.')) /// Qt6?: remove when compliant with RFC6265
            domain = domain.sliced(1);
#if QT_CONFIG(topleveldomain)
        if (urlHost != domain && qIsEffectiveTLD(domain))
            continue;
#else
        if (!domain.contains(u'.') && urlHost != domain)
            continue;
#endif // topleveldomain

        result += cookie;
    }

    auto longerPath = [](const auto &c1, const auto &c2)
                      { return c1.path().size() > c2.path().size(); };
    std::sort(result.begin(), result.end(), longerPath);
    return result;
}